

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Device.cxx
# Opt level: O1

void __thiscall Fl_Graphics_Driver::Fl_Graphics_Driver(Fl_Graphics_Driver *this)

{
  (this->super_Fl_Device)._vptr_Fl_Device = (_func_int **)&PTR_class_name_0027ac20;
  this->font_ = 0;
  this->size_ = 0;
  this->sptr = 0;
  this->rstack[0] = (Fl_Region)0x0;
  this->fl_clip_state_number = 0;
  this->rstackptr = 0;
  (this->m).a = 1.0;
  (this->m).b = 0.0;
  (this->m).c = 0.0;
  (this->m).d = 1.0;
  (this->m).x = 0.0;
  (this->m).y = 0.0;
  this->fl_matrix = &this->m;
  this->p = (XPoint *)0x0;
  this->font_descriptor_ = (Fl_Font_Descriptor *)0x0;
  this->p_size = 0;
  return;
}

Assistant:

Fl_Graphics_Driver::Fl_Graphics_Driver() {
  font_ = 0;
  size_ = 0;
  sptr=0; rstackptr=0; 
  rstack[0] = NULL;
  fl_clip_state_number=0;
  m = m0; 
  fl_matrix = &m; 
  p = (XPOINT *)0;
  font_descriptor_ = NULL;
  p_size = 0;
}